

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaSimple.c
# Opt level: O2

Pla_Man_t * Pla_ManFxPrepare(int nVars)

{
  uint nCapMin;
  ulong uVar1;
  Vec_Bit_t *__ptr;
  Vec_Wrd_t *__ptr_00;
  Pla_Man_t *pPVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  word Fill;
  word Fill_00;
  int Entry;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  char Buffer [1000];
  
  __ptr = Pla_ManPrimesTable(nVars);
  __ptr_00 = Pla_ManFxMinimize((word *)__ptr->pArray,nVars);
  uVar6 = 0;
  sprintf(Buffer,"primes%02d",nVars);
  nCapMin = __ptr_00->nSize;
  pPVar2 = (Pla_Man_t *)calloc(1,0x98);
  pcVar3 = Extra_FileDesignName(Buffer);
  pPVar2->pName = pcVar3;
  sVar4 = strlen(Buffer);
  pcVar3 = (char *)malloc(sVar4 + 1);
  strcpy(pcVar3,Buffer);
  pPVar2->pSpec = pcVar3;
  pPVar2->nIns = nVars;
  pPVar2->nOuts = 1;
  pPVar2->nInWords = ((nVars >> 5) + 1) - (uint)((nVars & 0x1fU) == 0);
  pPVar2->nOutWords = 1;
  Vec_IntGrow(&pPVar2->vCubes,nCapMin);
  uVar9 = 0;
  if (0 < (int)nCapMin) {
    uVar9 = (ulong)nCapMin;
  }
  for (; uVar9 != uVar6; uVar6 = uVar6 + 1) {
    (pPVar2->vCubes).pArray[uVar6] = (int)uVar6;
  }
  (pPVar2->vCubes).nSize = nCapMin;
  Vec_WrdFill(&pPVar2->vInBits,nCapMin * pPVar2->nInWords,Fill);
  Vec_WrdFill(&pPVar2->vOutBits,pPVar2->nOutWords * (pPVar2->vCubes).nSize,Fill_00);
  Vec_WecInit(&pPVar2->vCubeLits,(pPVar2->vCubes).nSize);
  Vec_WecInit(&pPVar2->vOccurs,pPVar2->nIns * 2);
  uVar6 = 0;
  if (nVars < 1) {
    nVars = 0;
  }
  for (; uVar6 != uVar9; uVar6 = uVar6 + 1) {
    uVar1 = __ptr_00->pArray[uVar6];
    iVar7 = 0;
    iVar8 = nVars;
    while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
      uVar5 = uVar1 >> ((byte)iVar7 & 0x3e);
      if ((uVar5 & 3) != 0) {
        Entry = (uint)(((uint)uVar5 & 3) == 1) + iVar7;
        Vec_WecPush(&pPVar2->vCubeLits,(int)uVar6,Entry);
        Vec_WecPush(&pPVar2->vOccurs,Entry,(int)uVar6);
      }
      iVar7 = iVar7 + 2;
    }
  }
  free(__ptr->pArray);
  free(__ptr);
  free(__ptr_00->pArray);
  free(__ptr_00);
  return pPVar2;
}

Assistant:

Pla_Man_t * Pla_ManFxPrepare( int nVars )
{
    Pla_Man_t * p; char Buffer[1000]; 
    Vec_Bit_t * vFunc = Pla_ManPrimesTable( nVars );
    Vec_Wrd_t * vSop = Pla_ManFxMinimize( (word *)Vec_BitArray(vFunc), nVars );
    word Cube, * pCube = &Cube; int i, k, Lit;
    sprintf( Buffer, "primes%02d", nVars );
    p = Pla_ManAlloc( Buffer, nVars, 1, Vec_WrdSize(vSop) );
    Vec_WecInit( &p->vCubeLits, Pla_ManCubeNum(p) );
    Vec_WecInit( &p->vOccurs, 2*Pla_ManInNum(p) );
    Vec_WrdForEachEntry( vSop, Cube, i )
        Pla_CubeForEachLit( nVars, pCube, Lit, k )
            if ( Lit != PLA_LIT_DASH )
            {
                Lit = Abc_Var2Lit( k, Lit == PLA_LIT_ZERO );
                Vec_WecPush( &p->vCubeLits, i, Lit );
                Vec_WecPush( &p->vOccurs, Lit, i );
            }
    Vec_BitFree( vFunc );
    Vec_WrdFree( vSop );
    return p;
}